

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::update_A(OjaNewton *this)

{
  long lVar1;
  long in_RDI;
  float fVar2;
  int j_4;
  int k_3;
  float temp;
  int j_3;
  float norm;
  int k_2;
  int j_2;
  int k_1;
  int j_1;
  int k;
  int j;
  int i;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 1; local_c <= *(int *)(in_RDI + 8); local_c = local_c + 1) {
    for (local_10 = 1; local_10 < local_c; local_10 = local_10 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_10 * 4) = 0;
      local_14 = 1;
      while( true ) {
        if (local_c < local_14) break;
        *(float *)(*(long *)(in_RDI + 0x48) + (long)local_10 * 4) =
             *(float *)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 8) + (long)local_14 * 4
                       ) *
             *(float *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)local_14 * 8) +
                       (long)local_10 * 4) +
             *(float *)(*(long *)(in_RDI + 0x48) + (long)local_10 * 4);
        local_14 = local_14 + 1;
      }
    }
    for (local_18 = 1; local_18 < local_c; local_18 = local_18 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)local_18 * 4) = 0;
      local_1c = 1;
      while( true ) {
        if (local_18 < local_1c) break;
        *(float *)(*(long *)(in_RDI + 0x50) + (long)local_18 * 4) =
             *(float *)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_18 * 8) +
                       (long)local_1c * 4) *
             *(float *)(*(long *)(in_RDI + 0x48) + (long)local_1c * 4) +
             *(float *)(*(long *)(in_RDI + 0x50) + (long)local_18 * 4);
        local_1c = local_1c + 1;
      }
    }
    for (local_20 = 1; local_20 < local_c; local_20 = local_20 + 1) {
      for (local_24 = local_20; local_24 < local_c; local_24 = local_24 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 8);
        *(float *)(lVar1 + (long)local_20 * 4) =
             -*(float *)(*(long *)(in_RDI + 0x50) + (long)local_24 * 4) *
             *(float *)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_24 * 8) +
                       (long)local_20 * 4) + *(float *)(lVar1 + (long)local_20 * 4);
      }
    }
    local_28 = 0.0;
    for (local_2c = 1; local_2c <= local_c; local_2c = local_2c + 1) {
      local_30 = 0.0;
      for (local_34 = 1; local_34 <= local_c; local_34 = local_34 + 1) {
        local_30 = *(float *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)local_2c * 8) +
                             (long)local_34 * 4) *
                   *(float *)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 8) +
                             (long)local_34 * 4) + local_30;
      }
      local_28 = *(float *)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 8) +
                           (long)local_2c * 4) * local_30 + local_28;
    }
    fVar2 = sqrtf(local_28);
    for (local_38 = 1; local_38 <= local_c; local_38 = local_38 + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 8);
      *(float *)(lVar1 + (long)local_38 * 4) = *(float *)(lVar1 + (long)local_38 * 4) / fVar2;
    }
  }
  return;
}

Assistant:

void update_A()
  {
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j < i; j++)
      {
        zv[j] = 0;
        for (int k = 1; k <= i; k++)
        {
          zv[j] += A[i][k] * K[k][j];
        }
      }

      for (int j = 1; j < i; j++)
      {
        vv[j] = 0;
        for (int k = 1; k <= j; k++)
        {
          vv[j] += A[j][k] * zv[k];
        }
      }

      for (int j = 1; j < i; j++)
      {
        for (int k = j; k < i; k++)
        {
          A[i][j] -= vv[k] * A[k][j];
        }
      }

      float norm = 0;
      for (int j = 1; j <= i; j++)
      {
        float temp = 0;
        for (int k = 1; k <= i; k++)
        {
          temp += K[j][k] * A[i][k];
        }
        norm += A[i][j] * temp;
      }
      norm = sqrtf(norm);

      for (int j = 1; j <= i; j++)
      {
        A[i][j] /= norm;
      }
    }
  }